

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uenum.cpp
# Opt level: O0

char * uenum_next_63(UEnumeration *en,int32_t *resultLength,UErrorCode *status)

{
  UBool UVar1;
  char *pcVar2;
  undefined4 local_2c;
  UErrorCode *pUStack_28;
  int32_t dummyLength;
  UErrorCode *status_local;
  int32_t *resultLength_local;
  UEnumeration *en_local;
  
  if ((en == (UEnumeration *)0x0) ||
     (pUStack_28 = status, status_local = resultLength, resultLength_local = (int32_t *)en,
     UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    return (char *)0x0;
  }
  if (*(long *)(resultLength_local + 10) == 0) {
    *pUStack_28 = U_UNSUPPORTED_ERROR;
    return (char *)0x0;
  }
  if (status_local != (UErrorCode *)0x0) {
    pcVar2 = (char *)(**(code **)(resultLength_local + 10))
                               (resultLength_local,status_local,pUStack_28);
    return pcVar2;
  }
  local_2c = 0;
  pcVar2 = (char *)(**(code **)(resultLength_local + 10))(resultLength_local,&local_2c,pUStack_28);
  return pcVar2;
}

Assistant:

U_CAPI const char* U_EXPORT2
uenum_next(UEnumeration* en,
          int32_t* resultLength,
          UErrorCode* status)
{
    if (!en || U_FAILURE(*status)) {
        return NULL;
    }
    if (en->next != NULL) {
        if (resultLength != NULL) {
            return en->next(en, resultLength, status);
        }
        else {
            int32_t dummyLength=0;
            return en->next(en, &dummyLength, status);
        }
    } else {
        *status = U_UNSUPPORTED_ERROR;
        return NULL;
    }
}